

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O0

ReadFileResult anon_unknown.dwarf_a8258e::VariableValueHelper(string *out,Value *value)

{
  bool bVar1;
  char *pcVar2;
  Value *value_local;
  string *out_local;
  
  if (value == (Value *)0x0) {
    std::__cxx11::string::clear();
    out_local._4_4_ = READ_OK;
  }
  else {
    bVar1 = Json::Value::isBool(value);
    if (bVar1) {
      bVar1 = Json::Value::asBool(value);
      pcVar2 = "FALSE";
      if (bVar1) {
        pcVar2 = "TRUE";
      }
      std::__cxx11::string::operator=((string *)out,pcVar2);
      out_local._4_4_ = READ_OK;
    }
    else {
      out_local._4_4_ =
           std::
           function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
           ::operator()((function<cmCMakePresetsGraph::ReadFileResult_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                         *)(anonymous_namespace)::VariableStringHelper_abi_cxx11_,out,value);
    }
  }
  return out_local._4_4_;
}

Assistant:

ReadFileResult VariableValueHelper(std::string& out, const Json::Value* value)
{
  if (!value) {
    out.clear();
    return ReadFileResult::READ_OK;
  }

  if (value->isBool()) {
    out = value->asBool() ? "TRUE" : "FALSE";
    return ReadFileResult::READ_OK;
  }

  return VariableStringHelper(out, value);
}